

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O3

void __thiscall Frame::pushIntoOperandStack(Frame *this,Value operand)

{
  iterator *piVar1;
  _Elt_pointer pVVar2;
  Value local_10;
  
  local_10.data = operand.data;
  local_10._0_8_ = operand._0_8_;
  pVVar2 = (this->_operandStack).c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pVVar2 == (this->_operandStack).c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<Value,std::allocator<Value>>::_M_push_back_aux<Value_const&>
              ((deque<Value,std::allocator<Value>> *)&this->_operandStack,&local_10);
  }
  else {
    pVVar2->printType = local_10.printType;
    pVVar2->type = local_10.type;
    (pVVar2->data).longValue = (int64_t)local_10.data;
    piVar1 = &(this->_operandStack).c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
              super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  return;
}

Assistant:

void Frame::pushIntoOperandStack(Value operand) {
    _operandStack.push(operand);
}